

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionsMap.h
# Opt level: O0

bool __thiscall
dg::dda::DefinitionsMap<dg::dda::RWNode>::
add<std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
          (DefinitionsMap<dg::dda::RWNode> *this,DefSite *ds,
          vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *nodes)

{
  bool bVar1;
  reference ppRVar2;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_RDI;
  RWNode *unaff_retaddr;
  RWNode *n;
  const_iterator __end0;
  const_iterator __begin0;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *__range3;
  bool changed;
  RWNode *in_stack_ffffffffffffffc0;
  __normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  local_30 [2];
  byte local_19;
  
  local_19 = 0;
  local_30[0]._M_current =
       (RWNode **)std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin(in_RDI);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    ppRVar2 = __gnu_cxx::
              __normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
              ::operator*(local_30);
    in_stack_ffffffffffffffc0 = *ppRVar2;
    bVar1 = add((DefinitionsMap<dg::dda::RWNode> *)__end0._M_current,(DefSite *)n,unaff_retaddr);
    local_19 = (local_19 & 1) != 0 || bVar1;
    __gnu_cxx::
    __normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
    ::operator++(local_30);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool add(const DefSite &ds, const ContainerT &nodes) {
        bool changed = false;
        for (auto *n : nodes)
            changed |= add(ds, n);
        return changed;
    }